

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O0

int compare_pair(void *a,void *b)

{
  int dcount;
  U32Pair *pb;
  U32Pair *pa;
  void *b_local;
  void *a_local;
  
  a_local._4_4_ = *(int *)((long)b + 4) - *(int *)((long)a + 4);
  if (a_local._4_4_ == 0) {
    a_local._4_4_ = *a - *b;
  }
  return a_local._4_4_;
}

Assistant:

int compare_pair(const void* a, const void* b) {
  U32Pair* pa = (U32Pair*)a;
  U32Pair* pb = (U32Pair*)b;
  int dcount = (int)pb->count - (int)pa->count;
  if (dcount != 0) {
    return dcount;
  }
  return (int)pa->value - (int)pb->value;
}